

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

idx_t duckdb::QuantileOperation::FrameSize<long>(QuantileIncluded<long> *included,SubFrames *frames)

{
  DataChunk *result;
  pointer pFVar1;
  unsigned_long *puVar2;
  CURSOR_TYPE *pCVar3;
  FrameBounds *frame;
  pointer pFVar4;
  reference pvVar5;
  ulong uVar6;
  idx_t iVar7;
  ValidityMask *pVVar8;
  FrameBounds *frame_1;
  idx_t seek_idx;
  
  if (((included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
       (unsigned_long *)0x0) && (included->dmask->all_valid == true)) {
    pFVar4 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar1 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar4 != pFVar1) {
      iVar7 = 0;
      do {
        iVar7 = (iVar7 + pFVar4->end) - pFVar4->start;
        pFVar4 = pFVar4 + 1;
      } while (pFVar4 != pFVar1);
      return iVar7;
    }
  }
  else {
    pFVar4 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar1 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar4 != pFVar1) {
      iVar7 = 0;
      do {
        for (seek_idx = pFVar4->start; seek_idx < pFVar4->end; seek_idx = seek_idx + 1) {
          puVar2 = (included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar2 == (unsigned_long *)0x0) ||
             ((puVar2[seek_idx >> 6] >> (seek_idx & 0x3f) & 1) != 0)) {
            pCVar3 = included->dmask;
            uVar6 = (pCVar3->scan).current_row_index;
            if (seek_idx < uVar6 || (pCVar3->scan).next_row_index <= seek_idx) {
              result = &pCVar3->page;
              ColumnDataCollection::Seek(pCVar3->inputs,seek_idx,&pCVar3->scan,result);
              pvVar5 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
              pCVar3->data = (long *)pvVar5->data;
              pvVar5 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
              FlatVector::VerifyFlatVector(pvVar5);
              pVVar8 = &pvVar5->validity;
              pCVar3->validity = pVVar8;
              uVar6 = (pCVar3->scan).current_row_index;
            }
            else {
              pVVar8 = pCVar3->validity;
            }
            puVar2 = (pVVar8->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (puVar2 == (unsigned_long *)0x0) {
              uVar6 = 1;
            }
            else {
              uVar6 = (ulong)((puVar2[seek_idx - uVar6 >> 6 & 0x3ffffff] >>
                               (seek_idx - uVar6 & 0x3f) & 1) != 0);
            }
          }
          else {
            uVar6 = 0;
          }
          iVar7 = iVar7 + uVar6;
        }
        pFVar4 = pFVar4 + 1;
      } while (pFVar4 != pFVar1);
      return iVar7;
    }
  }
  return 0;
}

Assistant:

static idx_t FrameSize(QuantileIncluded<INPUT_TYPE> &included, const SubFrames &frames) {
		//	Count the number of valid values
		idx_t n = 0;
		if (included.AllValid()) {
			for (const auto &frame : frames) {
				n += frame.end - frame.start;
			}
		} else {
			//	NULLs or FILTERed values,
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					n += included(i);
				}
			}
		}

		return n;
	}